

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-enum_parsing.c
# Opt level: O0

greatest_test_res pf_transfer_type(void)

{
  transfer_type_t tVar1;
  greatest_test_res local_c;
  
  greatest_info.assertions = greatest_info.assertions + 1;
  tVar1 = parse_transfer_type("0");
  if (tVar1 == TT_RECOMMENDED) {
    greatest_info.assertions = greatest_info.assertions + 1;
    tVar1 = parse_transfer_type("1");
    if (tVar1 == TT_TIMED) {
      greatest_info.assertions = greatest_info.assertions + 1;
      tVar1 = parse_transfer_type("2");
      if (tVar1 == TT_TIME_REQUIRED) {
        greatest_info.assertions = greatest_info.assertions + 1;
        tVar1 = parse_transfer_type("3");
        if (tVar1 == TT_NOT_POSSIBLE) {
          greatest_info.assertions = greatest_info.assertions + 1;
          tVar1 = parse_transfer_type("");
          if (tVar1 == TT_RECOMMENDED) {
            greatest_info.msg = (char *)0x0;
            local_c = GREATEST_TEST_RES_PASS;
          }
          else {
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-enum_parsing.c"
            ;
            greatest_info.fail_line = 0x66;
            greatest_info.msg = "TT_RECOMMENDED != parse_transfer_type(\"\")";
            if ((greatest_info.flags & 4) != 0) {
              abort();
            }
            local_c = GREATEST_TEST_RES_FAIL;
          }
        }
        else {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-enum_parsing.c"
          ;
          greatest_info.fail_line = 0x65;
          greatest_info.msg = "TT_NOT_POSSIBLE != parse_transfer_type(\"3\")";
          if ((greatest_info.flags & 4) != 0) {
            abort();
          }
          local_c = GREATEST_TEST_RES_FAIL;
        }
      }
      else {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-enum_parsing.c"
        ;
        greatest_info.fail_line = 100;
        greatest_info.msg = "TT_TIME_REQUIRED != parse_transfer_type(\"2\")";
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        local_c = GREATEST_TEST_RES_FAIL;
      }
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-enum_parsing.c"
      ;
      greatest_info.fail_line = 99;
      greatest_info.msg = "TT_TIMED != parse_transfer_type(\"1\")";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      local_c = GREATEST_TEST_RES_FAIL;
    }
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-enum_parsing.c"
    ;
    greatest_info.fail_line = 0x62;
    greatest_info.msg = "TT_RECOMMENDED != parse_transfer_type(\"0\")";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    local_c = GREATEST_TEST_RES_FAIL;
  }
  return local_c;
}

Assistant:

TEST pf_transfer_type(void) {
    ASSERT_EQ(TT_RECOMMENDED, parse_transfer_type("0"));
    ASSERT_EQ(TT_TIMED, parse_transfer_type("1"));
    ASSERT_EQ(TT_TIME_REQUIRED, parse_transfer_type("2"));
    ASSERT_EQ(TT_NOT_POSSIBLE, parse_transfer_type("3"));
    ASSERT_EQ(TT_RECOMMENDED, parse_transfer_type(""));
    PASS();
}